

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  IMkvReader *pReader;
  longlong element_start_00;
  long lVar1;
  Track **ppTVar2;
  long lVar3;
  ulong uVar4;
  Tracks *this_00;
  longlong element_start;
  long stop;
  longlong pos;
  longlong size;
  longlong id;
  Tracks *local_38;
  
  pos = this->m_start;
  stop = this->m_size + pos;
  pReader = this->m_pSegment->m_pReader;
  uVar4 = 0;
  local_38 = this;
  do {
    do {
      if (stop <= pos) {
        if (pos != stop) {
          return -2;
        }
        if ((long)uVar4 < 1) {
          return 0;
        }
        ppTVar2 = (Track **)
                  operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3,
                                 (nothrow_t *)&std::nothrow);
        local_38->m_trackEntries = ppTVar2;
        if (ppTVar2 == (Track **)0x0) {
          return -1;
        }
        local_38->m_trackEntriesEnd = ppTVar2;
        this_00 = local_38;
        pos = local_38->m_start;
        do {
          do {
            element_start_00 = pos;
            if (stop <= pos) {
              return (ulong)(pos == stop) * 2 + -2;
            }
            lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size);
            if (lVar1 < 0) {
              return lVar1;
            }
          } while (size == 0);
          lVar1 = pos + size;
          if (id == 0xae) {
            ppTVar2 = this_00->m_trackEntriesEnd;
            *ppTVar2 = (Track *)0x0;
            lVar3 = ParseTrackEntry(this_00,pos,size,element_start_00,lVar1 - element_start_00,
                                    ppTVar2);
            if (lVar3 != 0) {
              return lVar3;
            }
            this_00 = local_38;
            if (*ppTVar2 != (Track *)0x0) {
              local_38->m_trackEntriesEnd = local_38->m_trackEntriesEnd + 1;
            }
          }
          pos = lVar1;
        } while (lVar1 <= stop);
        return -2;
      }
      lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size);
      if (lVar1 < 0) {
        return lVar1;
      }
    } while (size == 0);
    if (id == 0xae) {
      if (0x7ffffffe < (long)uVar4) {
        return -1;
      }
      uVar4 = uVar4 + 1;
    }
    pos = size + pos;
  } while (pos <= stop);
  return -2;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}